

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolList.hpp
# Opt level: O2

Client * __thiscall
PoolList<Client>::append<Server&,Server::Client&,Address_const&,Client::ICallback&,Settings&>
          (PoolList<Client> *this,Server *a,Client *b,Address *c,ICallback *d,Settings *e)

{
  Client *pCVar1;
  
  pCVar1 = allocateFreeItem(this);
  Client::Client(pCVar1,a,b,c,d,e);
  pCVar1 = linkFreeItem(this,pCVar1);
  return pCVar1;
}

Assistant:

T& append(A a, B b, C c, D d, E e) {return linkFreeItem(new (allocateFreeItem()) T(a, b, c, d, e));}